

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apx_control_main.c
# Opt level: O3

void connect_and_send_message_tcp(char *address,uint16_t port,uint8_t addressFamily)

{
  adt_error_t aVar1;
  int32_t iVar2;
  uint uVar3;
  message_client_connection_t *self;
  
  if ((addressFamily & 0xf7) == 2) {
    self = message_client_connection_new(addressFamily);
    if (m_message == (adt_str_t *)0x0) {
      __assert_fail("m_message != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_control/src/apx_control_main.c"
                    ,0x1bd,"void connect_and_send_message_tcp(const char *, uint16_t, uint8_t)");
    }
    if (self != (message_client_connection_t *)0x0) {
      aVar1 = message_client_prepare_message(self,m_message);
      if (aVar1 == '\0') {
        iVar2 = message_client_connect_tcp(self,address,port);
        if (iVar2 == 0) {
          uVar3 = message_client_wait_for_message_transmitted(self);
          if (uVar3 != 0) {
            printf("message_client_wait_for_message_transmitted failed with %d\n",(ulong)uVar3);
          }
        }
        else {
          printf("Failed to connect at %s:%d\n",address,(ulong)port);
        }
      }
      else {
        puts("Failed to prepare data");
      }
      message_client_connection_delete(self);
      return;
    }
  }
  return;
}

Assistant:

static void connect_and_send_message_tcp(const char *address, uint16_t port, uint8_t addressFamily)
{
   if ((addressFamily == AF_INET) || (addressFamily == AF_INET6))
   {
      message_client_connection_t* connection = message_client_connection_new(addressFamily);
      assert(m_message != 0);
      if (connection != 0)
      {
         adt_error_t rc = message_client_prepare_message(connection, m_message);
         if (rc == ADT_NO_ERROR)
         {
            int32_t result;
            result = message_client_connect_tcp(connection, address, port);
            if (result != 0)
            {
               printf("Failed to connect at %s:%d\n", address, (int) port);
            }
            else
            {
               result = message_client_wait_for_message_transmitted(connection);
               if (result != 0)
               {
                  printf("message_client_wait_for_message_transmitted failed with %d\n", (int)result);
               }
            }
         }
         else
         {
            printf("Failed to prepare data\n");
         }
         message_client_connection_delete(connection);
      }
   }
}